

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O2

BasicBlock * __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::CreateBasicBlock(LoopUnswitch *this,iterator ip)

{
  IRContext *this_00;
  uint32_t res_id;
  DefUseManager *this_01;
  BasicBlock *pBVar1;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> this_02;
  pointer *__ptr;
  type tVar2;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_68;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_60;
  OperandList local_58;
  iterator ip_local;
  
  ip_local.iterator_ = ip.iterator_._M_current;
  ip_local.container_ = ip.container_;
  this_01 = IRContext::get_def_use_mgr(this->context_);
  pBVar1 = (BasicBlock *)operator_new(0x88);
  this_02.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        )operator_new(0x70);
  this_00 = this->context_;
  res_id = IRContext::TakeNextId(this_00);
  local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Instruction::Instruction
            ((Instruction *)
             this_02.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,this_00,
             OpLabel,0,res_id,&local_58);
  local_68._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
       (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
       this_02.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  BasicBlock::BasicBlock
            (pBVar1,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&local_68);
  local_60._M_head_impl = pBVar1;
  tVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::InsertBefore<false>
                    (&ip_local,(Uptr *)&local_60);
  pBVar1 = ((tVar2.iterator_._M_current._M_current)->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)&local_60);
  if (local_68._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       )0x0) {
    (**(code **)(*(long *)local_68._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                8))();
  }
  local_68._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
       (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        )0x0;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_58);
  pBVar1->function_ = this->function_;
  analysis::DefUseManager::AnalyzeInstDef
            (this_01,(Instruction *)
                     (pBVar1->label_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t);
  IRContext::set_instr_block
            (this->context_,
             (Instruction *)
             (pBVar1->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t,pBVar1);
  return pBVar1;
}

Assistant:

BasicBlock* CreateBasicBlock(Function::iterator ip) {
    analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

    // TODO(1841): Handle id overflow.
    BasicBlock* bb = &*ip.InsertBefore(std::unique_ptr<BasicBlock>(
        new BasicBlock(std::unique_ptr<Instruction>(new Instruction(
            context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})))));
    bb->SetParent(function_);
    def_use_mgr->AnalyzeInstDef(bb->GetLabelInst());
    context_->set_instr_block(bb->GetLabelInst(), bb);

    return bb;
  }